

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

void slang::SVInt::splitWords(SVInt *value,uint32_t *dest,uint32_t numWords)

{
  uint64_t *puVar1;
  uint in_EDX;
  long in_RSI;
  uint64_t val;
  uint32_t i;
  SVInt *in_stack_ffffffffffffffe0;
  uint local_18;
  
  for (local_18 = 0; local_18 < in_EDX; local_18 = local_18 + 1) {
    puVar1 = getRawData(in_stack_ffffffffffffffe0);
    in_stack_ffffffffffffffe0 = (SVInt *)puVar1[local_18];
    *(int *)(in_RSI + (ulong)(local_18 << 1) * 4) = (int)in_stack_ffffffffffffffe0;
    *(int *)(in_RSI + (ulong)(local_18 * 2 + 1) * 4) =
         (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20);
  }
  return;
}

Assistant:

void SVInt::splitWords(const SVInt& value, uint32_t* dest, uint32_t numWords) {
    for (uint32_t i = 0; i < numWords; i++) {
        uint64_t val = value.getRawData()[i];
        dest[i * 2] = uint32_t(val);
        dest[i * 2 + 1] = uint32_t(val >> 32);
    }
}